

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

void mouse_button_callback(GLFWwindow *window,int button,int action,int mods)

{
  int mods_local;
  int action_local;
  int button_local;
  GLFWwindow *window_local;
  
  if (button == 0) {
    if (action == 1) {
      override_pos = '\x01';
      set_ball_pos(cursor_x,cursor_y);
    }
    else {
      override_pos = '\0';
    }
  }
  return;
}

Assistant:

void mouse_button_callback( GLFWwindow* window, int button, int action, int mods )
{
   if (button != GLFW_MOUSE_BUTTON_LEFT)
      return;

   if (action == GLFW_PRESS)
   {
      override_pos = GL_TRUE;
      set_ball_pos(cursor_x, cursor_y);
   }
   else
   {
      override_pos = GL_FALSE;
   }
}